

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffrhdu(fitsfile *fptr,int *hdutype,int *status)

{
  int iVar1;
  char *__s1;
  int *in_RDX;
  undefined4 *in_RSI;
  long in_RDI;
  char urltype [20];
  char *xtension;
  char xname [71];
  char comm [73];
  char value [71];
  char name [75];
  char card [81];
  int tstatus;
  int ii;
  int *in_stack_00001e48;
  fitsfile *in_stack_00001e50;
  int *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  fitsfile *in_stack_fffffffffffffe28;
  char *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  int *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  char local_d8 [8];
  undefined1 local_d0;
  char local_88 [56];
  int *in_stack_ffffffffffffffb0;
  fitsfile *in_stack_ffffffffffffffb8;
  int local_24;
  int local_4;
  
  if (*in_RDX < 1) {
    iVar1 = ffgrec(in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                   (char *)in_stack_fffffffffffffe18,(int *)0x182264);
    if (iVar1 < 1) {
      strncpy(local_d8,local_88,8);
      local_d0 = 0;
      for (local_24 = 7; (-1 < local_24 && (local_d8[local_24] == ' ')); local_24 = local_24 + -1) {
        local_d8[local_24] = '\0';
      }
      iVar1 = ffpsvc(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                     in_stack_fffffffffffffea0);
      if (iVar1 < 1) {
        iVar1 = strcmp(local_d8,"SIMPLE");
        if (iVar1 == 0) {
          ffpinit(in_stack_00001e50,in_stack_00001e48);
          if (in_RSI != (undefined4 *)0x0) {
            *in_RSI = 0;
          }
        }
        else {
          iVar1 = strcmp(local_d8,"XTENSION");
          if (iVar1 == 0) {
            iVar1 = ffc2s(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                          &in_stack_fffffffffffffe28->HDUposition);
            if (0 < iVar1) {
              ffpmsg((char *)0x1823ea);
              ffpmsg((char *)0x1823f7);
              return *in_RDX;
            }
            for (__s1 = &stack0xfffffffffffffe38; *__s1 == ' '; __s1 = __s1 + 1) {
            }
            iVar1 = strcmp(__s1,"TABLE");
            if (iVar1 == 0) {
              ffainit((fitsfile *)xtension,stack0x00000010);
              if (in_RSI != (undefined4 *)0x0) {
                *in_RSI = 1;
              }
            }
            else {
              iVar1 = strcmp(__s1,"BINTABLE");
              if (((iVar1 == 0) || (iVar1 = strcmp(__s1,"A3DTABLE"), iVar1 == 0)) ||
                 (iVar1 = strcmp(__s1,"3DTABLE"), iVar1 == 0)) {
                ffbinit(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
                if (in_RSI != (undefined4 *)0x0) {
                  *in_RSI = 2;
                }
              }
              else {
                ffpinit(in_stack_00001e50,in_stack_00001e48);
                *in_RDX = 0;
                if (in_RSI != (undefined4 *)0x0) {
                  *in_RSI = 0;
                }
              }
            }
          }
          else if ((local_88[0] == '\0') || (local_88[0] == '\n')) {
            *in_RDX = 0x6b;
          }
          else {
            *in_RDX = 0xfc;
            ffpmsg((char *)0x1825ad);
            ffpmsg((char *)0x1825ba);
          }
        }
        if (*(long *)(*(long *)(*(long *)(in_RDI + 8) + 0x68) +
                     (long)(*(int *)(*(long *)(in_RDI + 8) + 0x54) + 1) * 8) <
            *(long *)(*(long *)(in_RDI + 8) + 0x30)) {
          *(undefined4 *)(*(long *)(in_RDI + 8) + 0x38) = 0;
        }
        else {
          *(undefined4 *)(*(long *)(in_RDI + 8) + 0x38) = 1;
          ffurlt((fitsfile *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 (char *)in_stack_fffffffffffffe18,(int *)0x18263c);
          iVar1 = strcmp(&stack0xfffffffffffffe18,"mem://");
          if ((iVar1 == 0) || (iVar1 = strcmp(&stack0xfffffffffffffe18,"memkeep://"), iVar1 == 0)) {
            fftrun(in_stack_fffffffffffffe28,
                   CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                   in_stack_fffffffffffffe18);
          }
        }
        local_4 = *in_RDX;
      }
      else {
        ffpmsg((char *)0x182333);
        ffpmsg((char *)0x182340);
        local_4 = *in_RDX;
      }
    }
    else {
      ffpmsg((char *)0x182275);
      local_4 = *in_RDX;
    }
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffrhdu(fitsfile *fptr,    /* I - FITS file pointer */
           int *hdutype,      /* O - type of HDU       */
           int *status)       /* IO - error status     */
/*
  read the required keywords of the CHDU and initialize the corresponding
  structure elements that describe the format of the HDU
*/
{
    int ii, tstatus;
    char card[FLEN_CARD];
    char name[FLEN_KEYWORD], value[FLEN_VALUE], comm[FLEN_COMMENT];
    char xname[FLEN_VALUE], *xtension, urltype[20];

    if (*status > 0)
        return(*status);

    if (ffgrec(fptr, 1, card, status) > 0 )  /* get the 80-byte card */
    {
        ffpmsg("Cannot read first keyword in header (ffrhdu).");
        return(*status);
    }
    strncpy(name,card,8);  /* first 8 characters = the keyword name */
    name[8] = '\0';

    for (ii=7; ii >= 0; ii--)  /* replace trailing blanks with nulls */
    {
        if (name[ii] == ' ')
            name[ii] = '\0';
        else
            break;
    }

    if (ffpsvc(card, value, comm, status) > 0)   /* parse value and comment */
    {
        ffpmsg("Cannot read value of first  keyword in header (ffrhdu):");
        ffpmsg(card);
        return(*status);
    }

    if (!strcmp(name, "SIMPLE"))        /* this is the primary array */
    {

       ffpinit(fptr, status);           /* initialize the primary array */

       if (hdutype != NULL)
           *hdutype = 0;
    }

    else if (!strcmp(name, "XTENSION"))   /* this is an XTENSION keyword */
    {
        if (ffc2s(value, xname, status) > 0)  /* get the value string */
        {
            ffpmsg("Bad value string for XTENSION keyword:");
            ffpmsg(value);
            return(*status);
        }

        xtension = xname;
        while (*xtension == ' ')  /* ignore any leading spaces in name */
           xtension++;

        if (!strcmp(xtension, "TABLE"))
        {
            ffainit(fptr, status);       /* initialize the ASCII table */
            if (hdutype != NULL)
                *hdutype = 1;
        }

        else if (!strcmp(xtension, "BINTABLE") ||
                 !strcmp(xtension, "A3DTABLE") ||
                 !strcmp(xtension, "3DTABLE") )
        {
            ffbinit(fptr, status);       /* initialize the binary table */
            if (hdutype != NULL)
                *hdutype = 2;
        }

        else
        {
            tstatus = 0;
            ffpinit(fptr, &tstatus);       /* probably an IMAGE extension */

            if (tstatus == UNKNOWN_EXT && hdutype != NULL)
                *hdutype = -1;       /* don't recognize this extension type */
            else
            {
                *status = tstatus;
                if (hdutype != NULL)
                    *hdutype = 0;
            }
        }
    }

    else     /*  not the start of a new extension */
    {
        if (card[0] == 0  ||
            card[0] == 10)     /* some editors append this character to EOF */
        {           
            *status = END_OF_FILE;
        }
        else
        {
          *status = UNKNOWN_REC;  /* found unknown type of record */
          ffpmsg
        ("Extension doesn't start with SIMPLE or XTENSION keyword. (ffrhdu)");
        ffpmsg(card);
        }
    }

    /*  compare the starting position of the next HDU (if any) with the size */
    /*  of the whole file to see if this is the last HDU in the file */

    if ((fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1] < 
        (fptr->Fptr)->logfilesize )
    {
        (fptr->Fptr)->lasthdu = 0;  /* no, not the last HDU */
    }
    else
    {
        (fptr->Fptr)->lasthdu = 1;  /* yes, this is the last HDU */

        /* special code for mem:// type files (FITS file in memory) */
        /* Allocate enough memory to hold the entire HDU. */
        /* Without this code, CFITSIO would repeatedly realloc  memory */
        /* to incrementally increase the size of the file by 2880 bytes */
        /* at a time, until it reached the final size */
 
        ffurlt(fptr, urltype, status);
        if (!strcmp(urltype,"mem://") || !strcmp(urltype,"memkeep://"))
        {
            fftrun(fptr, (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1],
               status);
        }
    }
    return(*status);
}